

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateDependencyManifestFile
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,GeneratorContextMap *output_directories,DiskSourceTree *source_tree)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  long in_RCX;
  undefined8 in_RDX;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RSI;
  string disk_file;
  string *virtual_file;
  FileDescriptorProto *file;
  int i_3;
  int i_2;
  Printer printer;
  FileOutputStream out;
  int fd;
  string output_filename;
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_output_filenames;
  GeneratorContextImpl *directory;
  string *location;
  value_type *pair;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorContextMap *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_filenames;
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  ostream *in_stack_fffffffffffffcf8;
  Printer *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd18;
  FileOutputStream *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  int iVar9;
  undefined4 in_stack_fffffffffffffd2c;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  int in_stack_fffffffffffffd4c;
  Printer *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  Printer *in_stack_fffffffffffffd60;
  string local_278 [32];
  string *local_258;
  FileDescriptorProto *local_250;
  int local_248;
  int local_244;
  int local_150;
  int local_14c;
  string local_148 [32];
  string local_128 [36];
  int local_104;
  undefined1 local_100 [32];
  Printer *local_e0;
  Printer *local_d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_true>
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  int local_8c;
  FileDescriptorSet local_58;
  long local_28;
  undefined8 local_20;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)in_stack_fffffffffffffd20);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)0x415461);
  for (local_8c = 0; uVar4 = (ulong)local_8c,
      sVar5 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(local_18), uVar4 < sVar5; local_8c = local_8c + 1) {
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::operator[](local_18,(long)local_8c);
    FileDescriptorSet::mutable_file(&local_58);
    GetTransitiveDependencies
              ((FileDescriptor *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffd38 >> 0x30,0),in_stack_fffffffffffffd30,
               (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x415525);
  local_c8._8_8_ = local_20;
  local_c8._M_allocated_capacity =
       (size_type)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                *)in_stack_fffffffffffffcf8);
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              *)in_stack_fffffffffffffcf8);
  while (bVar1 = std::__detail::operator!=
                           ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_true>
                             *)&local_c8._M_allocated_capacity,&local_d0), bVar1) {
    local_e0 = (Printer *)
               std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
                            *)0x41558a);
    local_d8 = local_e0;
    local_100._24_8_ =
         std::
         unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
         ::get((unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd60 = (Printer *)local_100;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4155cd);
    GeneratorContextImpl::GetOutputFilenames
              ((GeneratorContextImpl *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_104 = 0;
    while( true ) {
      in_stack_fffffffffffffd58 = (char *)(long)local_104;
      pcVar6 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_100);
      if (pcVar6 <= in_stack_fffffffffffffd58) break;
      in_stack_fffffffffffffd50 = local_e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100,(long)local_104);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd4c = std::__cxx11::string::compare((ulong)local_128,0,(char *)0x2);
      if (in_stack_fffffffffffffd4c == 0) {
        std::__cxx11::string::substr((ulong)local_148,(ulong)local_128);
        std::__cxx11::string::operator=(local_128,local_148);
        std::__cxx11::string::~string(local_148);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                  (value_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      std::__cxx11::string::~string(local_128);
      local_104 = local_104 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_false,_true>
                  *)in_stack_fffffffffffffd00);
  }
  do {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar2 = open(pcVar6,0x241,0x1b6);
    bVar1 = false;
    local_14c = iVar2;
    if (iVar2 < 0) {
      piVar7 = __errno_location();
      bVar1 = *piVar7 == 4;
    }
  } while (bVar1);
  if (local_14c < 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    perror(pcVar6);
    local_1 = 0;
    local_150 = 1;
  }
  else {
    io::FileOutputStream::FileOutputStream
              (in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
               (int)in_stack_fffffffffffffd18);
    io::Printer::Printer
              ((Printer *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (ZeroCopyOutputStream *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
               ,(char)((ulong)in_stack_fffffffffffffd00 >> 0x38));
    local_244 = 0;
    while( true ) {
      uVar4 = (ulong)local_244;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_b8);
      if (sVar5 <= uVar4) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_b8,(long)local_244);
      std::__cxx11::string::c_str();
      io::Printer::Print<>
                (in_stack_fffffffffffffd50,(char *)CONCAT44(in_stack_fffffffffffffd4c,iVar2));
      lVar8 = (long)local_244;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_b8);
      if (lVar8 == sVar5 - 1) {
        io::Printer::Print<>
                  (in_stack_fffffffffffffd50,(char *)CONCAT44(in_stack_fffffffffffffd4c,iVar2));
      }
      else {
        io::Printer::Print<>
                  (in_stack_fffffffffffffd50,(char *)CONCAT44(in_stack_fffffffffffffd4c,iVar2));
      }
      local_244 = local_244 + 1;
    }
    local_248 = 0;
    while (iVar9 = local_248, iVar3 = FileDescriptorSet::file_size((FileDescriptorSet *)0x41598a),
          iVar9 < iVar3) {
      local_250 = FileDescriptorSet::file
                            ((FileDescriptorSet *)in_stack_fffffffffffffd00,
                             (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      local_258 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4159d5);
      std::__cxx11::string::string(local_278);
      if (local_28 == 0) {
LAB_00415ac7:
        in_stack_fffffffffffffd00 =
             (Printer *)std::operator<<((ostream *)&std::cerr,"Unable to identify path for file ");
        in_stack_fffffffffffffcf8 =
             std::operator<<((ostream *)in_stack_fffffffffffffd00,(string *)local_258);
        std::ostream::operator<<(in_stack_fffffffffffffcf8,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_150 = 1;
      }
      else {
        bVar1 = DiskSourceTree::VirtualFileToDiskFile
                          ((DiskSourceTree *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                           (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                           (string *)in_stack_fffffffffffffd00);
        in_stack_fffffffffffffd14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd14);
        if (!bVar1) goto LAB_00415ac7;
        io::Printer::Print<char[10],std::__cxx11::string>
                  (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                   &in_stack_fffffffffffffd50->variable_delimiter_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd4c,iVar2));
        in_stack_fffffffffffffd0c = local_248;
        in_stack_fffffffffffffd10 = FileDescriptorSet::file_size((FileDescriptorSet *)0x415a72);
        if (in_stack_fffffffffffffd0c < in_stack_fffffffffffffd10 + -1) {
          io::Printer::Print<>
                    (in_stack_fffffffffffffd50,(char *)CONCAT44(in_stack_fffffffffffffd4c,iVar2));
        }
        local_150 = 0;
      }
      std::__cxx11::string::~string(local_278);
      if (local_150 != 0) goto LAB_00415b70;
      local_248 = local_248 + 1;
    }
    local_1 = 1;
    local_150 = 1;
LAB_00415b70:
    io::Printer::~Printer(in_stack_fffffffffffffd00);
    io::FileOutputStream::~FileOutputStream((FileOutputStream *)in_stack_fffffffffffffd00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)0x415bc2);
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)in_stack_fffffffffffffd00);
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineInterface::GenerateDependencyManifestFile(
    const std::vector<const FileDescriptor*>& parsed_files,
    const GeneratorContextMap& output_directories,
    DiskSourceTree* source_tree) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i], false, false, &already_seen,
                              file_set.mutable_file());
  }

  std::vector<std::string> output_filenames;
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    std::vector<std::string> relative_output_filenames;
    directory->GetOutputFilenames(&relative_output_filenames);
    for (int i = 0; i < relative_output_filenames.size(); i++) {
      std::string output_filename = location + relative_output_filenames[i];
      if (output_filename.compare(0, 2, "./") == 0) {
        output_filename = output_filename.substr(2);
      }
      output_filenames.push_back(output_filename);
    }
  }

  int fd;
  do {
    fd = open(dependency_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(dependency_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  io::Printer printer(&out, '$');

  for (int i = 0; i < output_filenames.size(); i++) {
    printer.Print(output_filenames[i].c_str());
    if (i == output_filenames.size() - 1) {
      printer.Print(":");
    } else {
      printer.Print(" \\\n");
    }
  }

  for (int i = 0; i < file_set.file_size(); i++) {
    const FileDescriptorProto& file = file_set.file(i);
    const std::string& virtual_file = file.name();
    std::string disk_file;
    if (source_tree &&
        source_tree->VirtualFileToDiskFile(virtual_file, &disk_file)) {
      printer.Print(" $disk_file$", "disk_file", disk_file);
      if (i < file_set.file_size() - 1) printer.Print("\\\n");
    } else {
      std::cerr << "Unable to identify path for file " << virtual_file
                << std::endl;
      return false;
    }
  }

  return true;
}